

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::createPoolNullParamsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkDevice device;
  DeviceInterface *vk;
  allocator<char> local_61;
  string local_60;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_40;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_40,vk,device,0,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Command Pool allocated correctly.",&local_61);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolNullParamsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	createCommandPool(vk, vkDevice, 0u, queueFamilyIndex);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}